

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_gesture.cpp
# Opt level: O2

void Am_Gesture_Stop_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  int iVar1;
  int iVar2;
  Am_Input_Char ic;
  Am_Object value_00;
  bool bVar3;
  Am_Value *pAVar4;
  ostream *poVar5;
  double dVar6;
  double dVar7;
  Am_Object local_140;
  Am_Feature_Vector local_138;
  Am_String classname;
  Am_Object chosen_command_obj;
  Am_Feature_Vector feat;
  double dist;
  Am_Value value;
  Am_Object local_100;
  Am_Inter_Internal_Method inter_method;
  Am_Object matching_cmd;
  Am_Object local_d0;
  Am_Value gesture_name;
  Am_Object inter_command_obj;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Feature_Vector local_48;
  Am_Inter_Location local_40;
  Am_Object local_38;
  
  inter_command_obj.data = (Am_Object_Data *)0x0;
  pAVar4 = Am_Object::Get(inter,0xc5,0);
  Am_Object::operator=(&inter_command_obj,pAVar4);
  Am_Object::Am_Object(&local_50,inter);
  bVar3 = Am_Inter_Tracing(&local_50);
  Am_Object::~Am_Object(&local_50);
  if (bVar3) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Gesture stopping over ");
    poVar5 = operator<<(poVar5,object);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  Am_Object::Am_Object(&local_58,inter);
  Am_Object::Am_Object(&local_60,&inter_command_obj);
  iVar1 = ev->x;
  iVar2 = ev->y;
  Am_Object::Am_Object(&local_68,event_window);
  gesture_new_point(&local_58,&local_60,iVar1,iVar2,&local_68,ev->input_char);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58);
  Am_Object::Am_Object(&local_70,inter);
  gesture_stop(&local_70);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Am_Object(&local_100,inter);
  Am_Point_List::Am_Point_List((Am_Point_List *)&inter_method);
  pAVar4 = Am_Object::Get(&local_100,0xb2,0);
  Am_Point_List::operator=((Am_Point_List *)&inter_method,pAVar4);
  gesture_name.type = 0;
  gesture_name.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar4 = Am_Object::Get(&local_100,0x140,1);
  Am_Value::operator=(&gesture_name,pAVar4);
  pAVar4 = Am_Object::Get(&local_100,0x143,0);
  dVar6 = Am_Value::operator_cast_to_double(pAVar4);
  pAVar4 = Am_Object::Get(&local_100,0x144,0);
  dVar7 = Am_Value::operator_cast_to_double(pAVar4);
  Am_Feature_Vector::Am_Feature_Vector(&feat,(Am_Point_List *)&inter_method);
  classname.data = (Am_String_Data *)0x0;
  bVar3 = Am_Value::Valid(&gesture_name);
  if (bVar3) {
    Am_Gesture_Classifier::Am_Gesture_Classifier
              ((Am_Gesture_Classifier *)&matching_cmd,&gesture_name);
    Am_Feature_Vector::Am_Feature_Vector(&local_48,&feat);
    Am_Gesture_Classifier::Classify
              ((Am_Gesture_Classifier *)&value,(Am_Feature_Vector *)&matching_cmd,
               (double *)&local_48,(double *)&chosen_command_obj);
    Am_String::operator=(&classname,(Am_String *)&value);
    Am_String::~Am_String((Am_String *)&value);
    Am_Feature_Vector::~Am_Feature_Vector(&local_48);
    Am_Gesture_Classifier::~Am_Gesture_Classifier((Am_Gesture_Classifier *)&matching_cmd);
  }
  else {
    Am_String::operator=(&classname,&Am_No_String);
    chosen_command_obj.data = (Am_Object_Data *)0x3ff0000000000000;
    dist = 0.0;
  }
  value._0_8_ = value._0_8_ & 0xffffffffffff0000;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  bVar3 = Am_String::Valid(&classname);
  if ((!bVar3 || (double)chosen_command_obj.data < dVar6) || ((0.0 < dVar7 && (dVar7 < dist)))) {
    Am_Value::operator=(&value,&Am_No_Value);
  }
  else {
    Am_Value::operator=(&value,&classname);
  }
  Am_Object::Am_Object(&local_140,&local_100);
  Am_Value::Am_Value((Am_Value *)&matching_cmd,&value);
  Am_Feature_Vector::Am_Feature_Vector(&local_138,&feat);
  dVar6 = dist;
  value_00 = chosen_command_obj;
  Am_Object::Set(&local_140,0x169,(Am_Value *)&matching_cmd,0);
  dVar7 = Am_Feature_Vector::StartX(&local_138);
  Am_Object::Set(&local_140,0x12f,(int)dVar7,0);
  dVar7 = Am_Feature_Vector::StartY(&local_138);
  Am_Object::Set(&local_140,0x130,(int)dVar7,0);
  dVar7 = Am_Feature_Vector::InitialSin(&local_138);
  Am_Object::Set(&local_140,0x131,dVar7,0);
  dVar7 = Am_Feature_Vector::InitialCos(&local_138);
  Am_Object::Set(&local_140,0x132,dVar7,0);
  dVar7 = Am_Feature_Vector::Dx2(&local_138);
  Am_Object::Set(&local_140,0x133,(int)dVar7,0);
  dVar7 = Am_Feature_Vector::Dy2(&local_138);
  Am_Object::Set(&local_140,0x134,(int)dVar7,0);
  dVar7 = Am_Feature_Vector::MagSq2(&local_138);
  Am_Object::Set(&local_140,0x135,dVar7,0);
  dVar7 = Am_Feature_Vector::EndX(&local_138);
  Am_Object::Set(&local_140,0x136,(int)dVar7,0);
  dVar7 = Am_Feature_Vector::EndY(&local_138);
  Am_Object::Set(&local_140,0x137,(int)dVar7,0);
  dVar7 = Am_Feature_Vector::MinX(&local_138);
  Am_Object::Set(&local_140,0x138,(int)dVar7,0);
  dVar7 = Am_Feature_Vector::MaxX(&local_138);
  Am_Object::Set(&local_140,0x139,(int)dVar7,0);
  dVar7 = Am_Feature_Vector::MinY(&local_138);
  Am_Object::Set(&local_140,0x13a,(int)dVar7,0);
  dVar7 = Am_Feature_Vector::MaxY(&local_138);
  Am_Object::Set(&local_140,0x13b,(int)dVar7,0);
  dVar7 = Am_Feature_Vector::PathR(&local_138);
  Am_Object::Set(&local_140,0x13c,dVar7,0);
  dVar7 = Am_Feature_Vector::PathTh(&local_138);
  Am_Object::Set(&local_140,0x13d,dVar7,0);
  dVar7 = Am_Feature_Vector::AbsTh(&local_138);
  Am_Object::Set(&local_140,0x13e,dVar7,0);
  dVar7 = Am_Feature_Vector::Sharpness(&local_138);
  Am_Object::Set(&local_140,0x13f,dVar7,0);
  Am_Object::Set(&local_140,0x141,(double)value_00.data,0);
  Am_Object::Set(&local_140,0x142,dVar6,0);
  Am_Feature_Vector::~Am_Feature_Vector(&local_138);
  Am_Value::~Am_Value((Am_Value *)&matching_cmd);
  Am_Object::~Am_Object(&local_140);
  Am_Value::~Am_Value(&value);
  Am_String::~Am_String(&classname);
  Am_Feature_Vector::~Am_Feature_Vector(&feat);
  Am_Value::~Am_Value(&gesture_name);
  Am_Point_List::~Am_Point_List((Am_Point_List *)&inter_method);
  Am_Object::~Am_Object(&local_100);
  chosen_command_obj.data = (Am_Object_Data *)0x0;
  gesture_name.type = 0;
  gesture_name.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Object::Am_Object(&local_d0,inter);
  Am_Value_List::Am_Value_List((Am_Value_List *)&inter_method);
  pAVar4 = Am_Object::Get(&local_d0,0xa2,0);
  Am_Value_List::operator=((Am_Value_List *)&inter_method,pAVar4);
  value.type = 0;
  value._2_6_ = 0;
  pAVar4 = Am_Object::Get(&local_d0,0x169,0);
  Am_String::operator=((Am_String *)&value,pAVar4);
  matching_cmd.data = (Am_Object_Data *)0x0;
  bVar3 = Am_Value_List::Valid((Am_Value_List *)&inter_method);
  if (bVar3) {
    bVar3 = Am_String::Valid((Am_String *)&value);
    if (bVar3) {
      Am_Value_List::Start((Am_Value_List *)&inter_method);
      while( true ) {
        bVar3 = Am_Value_List::Last((Am_Value_List *)&inter_method);
        if (bVar3) break;
        feat.data = (Am_Feature_Vector_Data *)0x0;
        pAVar4 = Am_Value_List::Get((Am_Value_List *)&inter_method);
        Am_Object::operator=((Am_Object *)&feat,pAVar4);
        classname.data = (Am_String_Data *)0x0;
        pAVar4 = Am_Object::Get((Am_Object *)&feat,0x150,0);
        Am_String::operator=(&classname,pAVar4);
        bVar3 = Am_String::operator==((Am_String *)&value,&classname);
        if (bVar3) {
          pAVar4 = Am_Object::Get((Am_Object *)&feat,0xcc,0);
          bVar3 = Am_Value::operator_cast_to_bool(pAVar4);
          if (bVar3) {
            Am_Object::operator=(&matching_cmd,(Am_Object *)&feat);
            Am_String::~Am_String(&classname);
            Am_Object::~Am_Object((Am_Object *)&feat);
            break;
          }
        }
        Am_String::~Am_String(&classname);
        Am_Object::~Am_Object((Am_Object *)&feat);
        Am_Value_List::Next((Am_Value_List *)&inter_method);
      }
    }
  }
  bVar3 = Am_Object::Valid(&matching_cmd);
  if (bVar3) {
    Am_Object::Am_Object((Am_Object *)&dist,&matching_cmd);
  }
  else {
    pAVar4 = Am_Object::Get(&local_d0,0xc5,0);
    Am_Object::Am_Object((Am_Object *)&dist,pAVar4);
  }
  Am_Object::~Am_Object(&matching_cmd);
  Am_String::~Am_String((Am_String *)&value);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&inter_method);
  Am_Object::operator=(&chosen_command_obj,(Am_Object *)&dist);
  Am_Object::~Am_Object((Am_Object *)&dist);
  Am_Object::~Am_Object(&local_d0);
  pAVar4 = Am_Object::Get(inter,0x169,1);
  Am_Value::operator=(&gesture_name,pAVar4);
  Am_Object::Set(&chosen_command_obj,0x169,&gesture_name,0);
  Am_Object::Am_Object(&local_78,inter);
  Am_Object::Am_Object(&local_80,&chosen_command_obj);
  iVar1 = ev->x;
  iVar2 = ev->y;
  Am_Object::Am_Object(&local_88,event_window);
  ic = ev->input_char;
  Am_Object::Am_Object(&local_38,object);
  Am_Inter_Location::Am_Inter_Location(&local_40,&Am_No_Location);
  Am_Call_Final_Do_And_Register
            (&local_78,&local_80,iVar1,iVar2,&local_88,ic,(Am_Object_Data *)&local_38,
             (Am_Inter_Location_Data *)&local_40,gesture_set_impl_command);
  Am_Inter_Location::~Am_Inter_Location(&local_40);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_78);
  inter_method.from_wrapper = (Am_Method_Wrapper *)0x0;
  inter_method.Call = (Am_Inter_Internal_Method_Type *)0x0;
  pAVar4 = Am_Object::Get(&Am_Interactor,0xc2,0);
  Am_Inter_Internal_Method::operator=(&inter_method,pAVar4);
  (*inter_method.Call)(inter,object,event_window,ev);
  Am_Value::~Am_Value(&gesture_name);
  Am_Object::~Am_Object(&chosen_command_obj);
  Am_Object::~Am_Object(&inter_command_obj);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Gesture_Stop_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{
  Am_Object inter_command_obj;
  inter_command_obj = inter.Get(Am_COMMAND);

  if (Am_Inter_Tracing(inter))
    std::cout << "Gesture stopping over " << object << std::endl;

  // get last point
  gesture_new_point(inter, inter_command_obj, ev->x, ev->y, event_window,
                    ev->input_char);
  gesture_stop(inter);

  // classify the gesture and store its name in Am_VALUE
  gesture_classify(inter);

  // choose the appropriate command object to invoke (either from Am_ITEMS
  // list or from Am_COMMAND slot) and store the gesture name in its Am_VALUE
  Am_Object chosen_command_obj;
  Am_Value gesture_name;
  chosen_command_obj = choose_command_obj(inter);
  gesture_name = inter.Peek(Am_VALUE);
  chosen_command_obj.Set(Am_VALUE, gesture_name);

  // invoke the Do methods and register for undo
  Am_Call_Final_Do_And_Register(inter, chosen_command_obj, ev->x, ev->y,
                                event_window, ev->input_char, object,
                                Am_No_Location, gesture_set_impl_command);

  // LAST, call our prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_STOP_METHOD);
  inter_method.Call(inter, object, event_window, ev);
}